

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jkGetF0.cc
# Opt level: O0

int sptk::snack::init_dp_f0(double freq,F0_params *par,long *buffsize,long *sdstep,Buffer *buffer)

{
  int iVar1;
  int nlags;
  Frame *pFVar2;
  void *pvVar3;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long in_RDI;
  double in_XMM0_Qa;
  double dVar4;
  int downpatch;
  int ind;
  int agap;
  int stat_wsize;
  int i;
  int nframes;
  int local_48;
  int local_30;
  int local_2c;
  
  *(undefined4 *)(in_RCX + 7) = *(undefined4 *)(in_RDI + 0xc);
  *(undefined4 *)((long)in_RCX + 0x3c) = *(undefined4 *)(in_RDI + 0x10);
  *(undefined4 *)(in_RCX + 8) = *(undefined4 *)(in_RDI + 0x14);
  *(undefined4 *)(in_RCX + 9) = *(undefined4 *)(in_RDI + 0x18);
  *(undefined4 *)((long)in_RCX + 0x4c) = *(undefined4 *)(in_RDI + 0x1c);
  *(undefined4 *)((long)in_RCX + 0x44) = *(undefined4 *)(in_RDI + 0x30);
  iVar1 = eround((double)*(float *)((long)in_RCX + 0x44) * in_XMM0_Qa);
  *(int *)(in_RCX + 0xc) = iVar1;
  iVar1 = eround((double)*(float *)(in_RDI + 0x34) * in_XMM0_Qa);
  *(int *)((long)in_RCX + 100) = iVar1;
  *(float *)((long)in_RCX + 0x44) = (float)((double)(int)in_RCX[0xc] / in_XMM0_Qa);
  *(float *)(in_RCX + 10) = (float)((double)*(int *)((long)in_RCX + 100) / in_XMM0_Qa);
  iVar1 = eround(in_XMM0_Qa / (double)*(float *)(in_RDI + 0x2c));
  *(int *)((long)in_RCX + 0x6c) = iVar1;
  iVar1 = eround(in_XMM0_Qa / (double)*(float *)(in_RDI + 0x28));
  *(int *)(in_RCX + 0xe) = iVar1;
  *(int *)(in_RCX + 0xd) = ((int)in_RCX[0xe] - *(int *)((long)in_RCX + 0x6c)) + 1;
  *(int *)((long)in_RCX + 0x74) = *(int *)((long)in_RCX + 100) + (int)in_RCX[0xe] + 1;
  *(short *)(in_RCX + 0x10) = (short)((int)in_RCX[0xd] / 2) + 2;
  dVar4 = log(2.0);
  *(float *)((long)in_RCX + 0x54) = (float)dVar4;
  *(int *)(in_RCX + 5) = (int)(0.5 / *(float *)((long)in_RCX + 0x44));
  *(int *)((long)in_RCX + 0x2c) = (int)(1.0 / *(float *)((long)in_RCX + 0x44));
  *(float *)((long)in_RCX + 0x5c) = *(float *)(in_RDI + 4) / (float)(int)in_RCX[0xe];
  *(float *)(in_RCX + 0xb) = *(float *)(in_RDI + 8) / *(float *)((long)in_RCX + 0x44);
  if (*(int *)((long)in_RCX + 0x74) < (int)in_RCX[0xc]) {
    local_2c = (int)(in_XMM0_Qa * 0.2) / (int)in_RCX[0xc];
  }
  else {
    local_2c = ((int)(in_XMM0_Qa * 0.2) - *(int *)((long)in_RCX + 0x74)) / (int)in_RCX[0xc] + 1;
  }
  iVar1 = ((int)(in_XMM0_Qa * 0.005) + 1) / 2;
  nlags = ((int)(in_XMM0_Qa * 0.02) - (int)(in_XMM0_Qa * 0.03)) / 2;
  local_48 = (int)(in_XMM0_Qa * 0.03) + nlags;
  if (local_48 <= *(int *)((long)in_RCX + 0x74)) {
    local_48 = *(int *)((long)in_RCX + 0x74);
  }
  *(int *)((long)in_RCX + 0xbc) = iVar1 + local_48;
  *in_RSI = (long)(local_2c * (int)in_RCX[0xc] + *(int *)((long)in_RCX + 0xbc));
  *in_RDX = (long)(local_2c * (int)in_RCX[0xc]);
  *(int *)((long)in_RCX + 0x24) = (int)(1.5 / *(float *)((long)in_RCX + 0x44));
  pFVar2 = alloc_frame(nlags,iVar1);
  in_RCX[1] = (long)pFVar2;
  *in_RCX = in_RCX[1];
  for (local_30 = 1; local_30 < *(int *)((long)in_RCX + 0x24); local_30 = local_30 + 1) {
    pFVar2 = alloc_frame(nlags,iVar1);
    *(Frame **)(*in_RCX + 0x18) = pFVar2;
    *(long *)(*(long *)(*in_RCX + 0x18) + 0x20) = *in_RCX;
    *in_RCX = *(long *)(*in_RCX + 0x18);
  }
  *(long *)(*in_RCX + 0x18) = in_RCX[1];
  *(long *)(in_RCX[1] + 0x20) = *in_RCX;
  *in_RCX = in_RCX[1];
  if (in_RCX[3] == 0) {
    pvVar3 = ckalloc(0x1371ee);
    in_RCX[3] = (long)pvVar3;
  }
  *(undefined4 *)((long)in_RCX + 0x34) = *(undefined4 *)((long)in_RCX + 0x24);
  pvVar3 = ckalloc(0x13721c);
  in_RCX[0x14] = (long)pvVar3;
  pvVar3 = ckalloc(0x13723d);
  in_RCX[0x12] = (long)pvVar3;
  pvVar3 = ckalloc(0x13725e);
  in_RCX[0x13] = (long)pvVar3;
  pvVar3 = ckalloc(0x13727f);
  in_RCX[0x15] = (long)pvVar3;
  pvVar3 = ckalloc(0x1372a4);
  in_RCX[0x16] = (long)pvVar3;
  pvVar3 = ckalloc(0x1372c9);
  in_RCX[0xf] = (long)pvVar3;
  *(int *)((long)in_RCX + 0x84) = (int)(in_XMM0_Qa * 0.02) / (int)in_RCX[0xc];
  if (*(int *)((long)in_RCX + 0x84) != 0) {
    pvVar3 = ckalloc(0x137319);
    in_RCX[0x11] = (long)pvVar3;
    for (local_30 = 0; local_30 < *(int *)((long)in_RCX + 0x84); local_30 = local_30 + 1) {
      *(undefined4 *)(in_RCX[0x11] + (long)local_30 * 0x19c + 0x194) = 0;
      *(undefined4 *)(in_RCX[0x11] + (long)local_30 * 0x19c + 0x198) = 0;
    }
  }
  if (debug_level != 0) {
    fprintf(_stderr,"done with initialization:\n");
    fprintf(_stderr," size_cir_buffer:%d  xcorr frame size:%d start lag:%d nlags:%d\n",
            (ulong)*(uint *)((long)in_RCX + 0x24),(ulong)*(uint *)((long)in_RCX + 100),
            (ulong)*(uint *)((long)in_RCX + 0x6c),(ulong)*(uint *)(in_RCX + 0xd));
  }
  *(undefined4 *)(in_RCX + 6) = 0;
  *(undefined4 *)(in_RCX + 0x17) = 1;
  return 0;
}

Assistant:

init_dp_f0(double freq, F0_params *par, long *buffsize, long *sdstep, Buffer *buffer)
{
  int nframes;
  int i;
  int stat_wsize, agap, ind, downpatch;
/*
 * reassigning some constants 
 */

  buffer->tcost = par->trans_cost;
  buffer->tfact_a = par->trans_amp;
  buffer->tfact_s = par->trans_spec;
  buffer->vbias = par->voice_bias;
  buffer->fdouble = par->double_cost;
  buffer->frame_int = par->frame_step;
  
  buffer->step = eround(buffer->frame_int * freq);
  buffer->size = eround(par->wind_dur * freq);
  buffer->frame_int = (float)(((float)buffer->step)/freq);
  buffer->wdur = (float)(((float)buffer->size)/freq);
  buffer->start = eround(freq / par->max_f0);
  buffer->stop = eround(freq / par->min_f0);
  buffer->nlags = buffer->stop - buffer->start + 1;
  buffer->ncomp = buffer->size + buffer->stop + 1; /* # of samples required by xcorr
			      comp. per fr. */
  buffer->maxpeaks = 2 + (buffer->nlags/2);	/* maximum number of "peaks" findable in ccf */
  buffer->ln2 = (float)log(2.0);
  buffer->size_frame_hist = (int) (DP_HIST / buffer->frame_int);
  buffer->size_frame_out = (int) (DP_LIMIT / buffer->frame_int);

/*
 * SET UP THE D.P. WEIGHTING FACTORS:
 *      The intent is to make the effectiveness of the various fudge factors
 *      independent of frame rate or sampling frequency.                
 */
  
  /* Lag-dependent weighting factor to emphasize early peaks (higher freqs)*/
  buffer->lagwt = par->lag_weight/buffer->stop;
  
  /* Penalty for a frequency skip in F0 per frame */
  buffer->freqwt = par->freq_weight/buffer->frame_int;
  
  i = (int) (READ_SIZE *freq);
  if(buffer->ncomp >= buffer->step) nframes = ((i-buffer->ncomp)/buffer->step ) + 1;
  else nframes = i / buffer->step;

  /* *buffsize is the number of samples needed to make F0 computation
     of nframes DP frames possible.  The last DP frame is patched with
     enough points so that F0 computation on it can be carried.  F0
     computaion on each frame needs enough points to do

     1) xcross or cross correlation measure:
           enough points to do xcross - ncomp

     2) stationarity measure:
           enough to make 30 msec windowing possible - ind

     3) downsampling:
           enough to make filtering possible -- downpatch
 
     So there are nframes whole DP frames, padded with pad points
     to make the last frame F0 computation ok.

  */

  /* last point in data frame needs points of 1/2 downsampler filter length 
     long, 0.005 is the filter length used in downsampler */
  downpatch = (((int) (freq * 0.005))+1) / 2;

  stat_wsize = (int) (STAT_WSIZE * freq);
  agap = (int) (STAT_AINT * freq);
  ind = ( agap - stat_wsize ) / 2;
  i = stat_wsize + ind;
  buffer->pad = downpatch + ((i>buffer->ncomp) ? i:buffer->ncomp);
  *buffsize = nframes * buffer->step + buffer->pad;
  *sdstep = nframes * buffer->step;
  
  /* Allocate space for the DP storage circularly linked data structure */

  buffer->size_cir_buffer = (int) (DP_CIRCULAR / buffer->frame_int);

  /* creating circularly linked data structures */
  buffer->tailF = alloc_frame(buffer->nlags, par->n_cands);
  buffer->headF = buffer->tailF;

  /* link them up */
  for(i=1; i<buffer->size_cir_buffer; i++){
    buffer->headF->next = alloc_frame(buffer->nlags, par->n_cands);
    buffer->headF->next->prev = buffer->headF;
    buffer->headF = buffer->headF->next;
  }
  buffer->headF->next = buffer->tailF;
  buffer->tailF->prev = buffer->headF;

  buffer->headF = buffer->tailF;

  /* Allocate sscratch array to use during backtrack convergence test. */
  if( ! buffer->pcands ) {
    buffer->pcands = (int *) ckalloc( par->n_cands * sizeof(int));
    /*    spsassert(pcands,"can't allocate pathcands");*/
  }

  /* Allocate arrays to return F0 and related signals. */

  /* Note: remember to compare *vecsize with size_frame_out, because
     size_cir_buffer is not constant */
  buffer->output_buf_size = buffer->size_cir_buffer;
  buffer->rms_speech = (float*)ckalloc(sizeof(float) * buffer->output_buf_size);
  /*  spsassert(rms_speech,"rms_speech ckalloc failed");*/
  buffer->f0p = (float*)ckalloc(sizeof(float) * buffer->output_buf_size);
  /*  spsassert(f0p,"f0p ckalloc failed");*/
  buffer->vuvp = (float*)ckalloc(sizeof(float)* buffer->output_buf_size);
  /*  spsassert(vuvp,"vuvp ckalloc failed");*/
  buffer->acpkp = (float*)ckalloc(sizeof(float) * buffer->output_buf_size);
  /*  spsassert(acpkp,"acpkp ckalloc failed");*/

  /* Allocate space for peak location and amplitude scratch arrays. */
  buffer->peaks = (float*)ckalloc(sizeof(float) * buffer->maxpeaks);
  /*  spsassert(peaks,"peaks ckalloc failed");*/
  buffer->locs = (int*)ckalloc(sizeof(int) * buffer->maxpeaks);
  /*  spsassert(locs, "locs ckalloc failed");*/
  
  /* Initialise the retrieval/saving scheme of window statistic measures */
  buffer->wReuse = agap / buffer->step;
  if (buffer->wReuse){
      buffer->windstat = (Windstat *) ckalloc( buffer->wReuse * sizeof(Windstat));
      /*      spsassert(windstat, "windstat ckalloc failed");*/
      for(i=0; i<buffer->wReuse; i++){
	  buffer->windstat[i].err = 0;
	  buffer->windstat[i].rms = 0;
      }
  }

  if(debug_level){
    Fprintf(stderr, "done with initialization:\n");
    Fprintf(stderr,
	    " size_cir_buffer:%d  xcorr frame size:%d start lag:%d nlags:%d\n",
	    buffer->size_cir_buffer, buffer->size, buffer->start, buffer->nlags);
  }

  buffer->num_active_frames = 0;
  buffer->first_time = 1;

  return(0);
}